

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(string *presetName,cmJSONState *state)

{
  string local_30;
  
  cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_30,(char (*) [29])"Invalid macro expansion in \"",presetName,
             (char (*) [2])0x6a2b8e);
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void INVALID_MACRO_EXPANSION(const std::string& presetName, cmJSONState* state)
{
  state->AddError(cmStrCat("Invalid macro expansion in \"", presetName, "\""));
}